

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_Look(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *this;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  AActor *pAVar4;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar5;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar6;
  AActor *pAVar7;
  FSoundID *sound_id;
  char *__assertion;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 other;
  bool bVar8;
  float attenuation;
  NActorIterator iterator;
  FSoundID local_34;
  FSoundID local_30;
  FName local_2c;
  NActorIterator local_28;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
LAB_003f2e8b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x79e,"int AF_AActor_A_Look(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003f2e8b;
  }
  this = *(AActor **)&param->field_0;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
    }
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    bVar8 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar8) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar8) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f2e8b;
    }
  }
  if (((this->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    local_28.super_FActorIterator.id = this->args[1];
    local_28.super_FActorIterator.base = (AActor *)0x0;
    local_2c.Index = 0x111;
    local_28.type = PClass::FindClass(&local_2c);
    this->special = 0;
    pAVar4 = NActorIterator::Next(&local_28);
    (this->goal).field_0.p = pAVar4;
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    (this->flags5).Value = (uint)(this->args[3] != 0) << 7 | (this->flags5).Value & 0xffffff7f;
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if (((i_compatflags._1_1_ & 8) == 0) && (((this->flags).Value & 8) == 0)) {
      paVar6 = &(this->LastHeard).field_0;
    }
    else {
      paVar6 = &(this->Sector->SoundTarget).field_0;
    }
    aVar5.p = paVar6->p;
    if ((aVar5.p != (AActor *)0x0) &&
       ((((aVar5.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      paVar6->p = (AActor *)0x0;
      aVar5.p = (AActor *)0x0;
    }
    other.p = (AActor *)0x0;
    if ((aVar5.p != (AActor *)0x0) && (0 < (aVar5.p)->health)) {
      other = aVar5;
    }
    if (other.p == (AActor *)0x0) goto LAB_003f2c99;
    if (((other.p)->player != (player_t *)0x0) && (((other.p)->player->cheats & 8) != 0)) {
      return 0;
    }
  }
  else {
    other = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)(this->target).field_0.p;
    if ((other.p != (AActor *)0x0) &&
       ((((other.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->target).field_0.p = (AActor *)0x0;
LAB_003f2c99:
      other.p = (AActor *)0x0;
    }
  }
  if (((this->flags).Value & 0x40000000) != 0) {
    this->visdir = -1;
  }
  if ((other.p != (AActor *)0x0) && ((((other.p)->flags).Value & 4) != 0)) {
    bVar8 = AActor::IsFriend(this,other.p);
    if (bVar8) {
      bVar8 = P_LookForPlayers(this,(this->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (bVar8) goto LAB_003f2cdc;
      if (this->SeeState == (FState *)0x0) {
        A_Wander(this,0);
      }
      else {
        AActor::SetState(this,this->SeeState,false);
      }
    }
    else {
      (this->target).field_0.p = (AActor *)other;
      if (((this->flags).Value & 0x20) == 0) goto LAB_003f2cdc;
      if ((((other.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->target).field_0.p = (AActor *)0x0;
        other.p = (AActor *)0x0;
      }
      bVar8 = P_CheckSight(this,other.p,4);
      if (bVar8) goto LAB_003f2cdc;
    }
  }
  bVar8 = P_LookForPlayers(this,(this->flags4).Value & 0x10000,(FLookExParams *)0x0);
  if (!bVar8) {
    return 0;
  }
LAB_003f2cdc:
  pAVar4 = (this->goal).field_0.p;
  if ((pAVar4 != (AActor *)0x0) &&
     (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->goal).field_0.p = (AActor *)0x0;
    pAVar4 = (AActor *)0x0;
  }
  pAVar7 = (this->target).field_0.p;
  if ((pAVar7 != (AActor *)0x0) &&
     (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->target).field_0.p = (AActor *)0x0;
    pAVar7 = (AActor *)0x0;
  }
  if (pAVar7 == pAVar4) {
    if (level.maptime < this->reactiontime) {
      (this->target).field_0.p = (AActor *)0x0;
    }
  }
  else {
    iVar2 = (this->SeeSound).super_FSoundID.ID;
    if (iVar2 != 0) {
      if (((this->flags2).Value & 0x8000) == 0) {
        sound_id = &local_34;
        attenuation = 1.0;
        local_34.ID = iVar2;
      }
      else {
        sound_id = &local_30;
        attenuation = 0.0;
        local_30.ID = iVar2;
      }
      S_Sound(this,2,sound_id,1.0,attenuation);
    }
  }
  pAVar4 = (this->target).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      AActor::SetState(this,this->SeeState,false);
    }
    else {
      (this->target).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator (NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0) self->flags5 &= ~MF5_CHASEGOAL;
		else self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)? 
			self->Sector->SoundTarget : self->LastHeard;

		// [RH] If the soundtarget is dead, don't chase it
		if (targ != NULL && targ->health <= 0)
		{
			targ = NULL;
		}

		if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
		{
			return 0;
		}
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			// If we find a valid target here, the wandering logic should *not*
			// be activated! It would cause the seestate to be set twice.
			if (P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto seeyou;

			// Let the self wander around aimlessly looking for a fight
			if (self->SeeState != NULL)
			{
				self->SetState (self->SeeState);
			}
			else
			{
				A_Wander(self);
			}
		}
		else
		{
			self->target = targ;

			if (self->flags & MF_AMBUSH)
			{
				if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING))
					goto seeyou;
			}
			else
				goto seeyou;
		}
	}
	
	if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
		return 0;
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound)
	{
		if (self->flags2 & MF2_BOSS)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target)
	{
		self->SetState (self->SeeState);
	}
	return 0;
}